

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O2

SumVec * __thiscall Clasp::SharedMinimizeData::setOptimum(SharedMinimizeData *this,wsum_t *newOpt)

{
  uint uVar1;
  __int_type _Var2;
  __int_type _Var3;
  pod_vector<long,std::allocator<long>> *this_00;
  
  if (this->optGen_ == 0) {
    uVar1 = (this->gCount_).super___atomic_base<unsigned_int>._M_i;
    this_00 = (pod_vector<long,std::allocator<long>> *)
              ((long)&this->up_[0].ebo_.buf + (ulong)((~uVar1 & 1) << 4));
    bk_lib::pod_vector<long,std::allocator<long>>::assign<long_const*>
              (this_00,newOpt,newOpt + (this->adjust_).ebo_.size);
    if (this->mode_ != enumerate) {
      _Var3 = uVar1 + 1;
      _Var2 = 2;
      if (_Var3 != 0) {
        _Var2 = _Var3;
      }
      LOCK();
      (this->gCount_).super___atomic_base<unsigned_int>._M_i = _Var2;
      UNLOCK();
    }
  }
  else {
    this_00 = (pod_vector<long,std::allocator<long>> *)
              ((long)&this->up_[0].ebo_.buf + (ulong)((this->optGen_ & 1) << 4));
  }
  return (SumVec *)this_00;
}

Assistant:

const SumVec* SharedMinimizeData::setOptimum(const wsum_t* newOpt) {
	if (optGen_) { return up_ + (optGen_&1u); }
	uint32  g = gCount_;
	uint32  n = 1u - (g & 1u);
	SumVec& U = up_[n];
	U.assign(newOpt, newOpt + numRules());
	assert(mode() != MinimizeMode_t::enumerate || n == 1);
	if (mode() != MinimizeMode_t::enumerate) {
		if (++g == 0) { g = 2; }
		gCount_  = g;
	}
	return &U;
}